

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_188c2::fillChannels(Rand48 *random,DeepImage *img)

{
  LevelMode LVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int y;
  uint uVar4;
  int x;
  int iVar5;
  ulong uVar6;
  
  LVar1 = Imf_2_5::Image::levelMode(&img->super_Image);
  if (LVar1 == ONE_LEVEL) {
    poVar3 = std::operator<<((ostream *)&std::cout,"        level 0");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = (*(img->super_Image)._vptr_Image[3])(img,0);
    fillChannels(random,(DeepImageLevel *)CONCAT44(extraout_var_01,iVar2));
    return;
  }
  if (LVar1 == MIPMAP_LEVELS) {
    uVar4 = 0;
    while( true ) {
      iVar2 = Imf_2_5::Image::numLevels(&img->super_Image);
      if (iVar2 <= (int)uVar4) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"        level ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar4);
      poVar3 = std::operator<<(poVar3,"");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = (*(img->super_Image)._vptr_Image[3])(img,(ulong)uVar4);
      fillChannels(random,(DeepImageLevel *)CONCAT44(extraout_var_00,iVar2));
      uVar4 = uVar4 + 1;
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                    ,0x154,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImage &)");
    }
    uVar4 = 0;
    while( true ) {
      iVar2 = Imf_2_5::Image::numYLevels(&img->super_Image);
      if (iVar2 <= (int)uVar4) break;
      uVar6 = 0;
      while( true ) {
        iVar2 = Imf_2_5::Image::numXLevels(&img->super_Image);
        iVar5 = (int)uVar6;
        if (iVar2 <= iVar5) break;
        poVar3 = std::operator<<((ostream *)&std::cout,"        level (");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar5);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar4);
        poVar3 = std::operator<<(poVar3,")");
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = (*(img->super_Image)._vptr_Image[5])(img,uVar6,(ulong)uVar4);
        fillChannels(random,(DeepImageLevel *)CONCAT44(extraout_var,iVar2));
        uVar6 = (ulong)(iVar5 + 1);
      }
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48 &random, DeepImage &img)
{
    switch (img.levelMode())
    {
      case ONE_LEVEL:

        cout << "        level 0" << endl;
        fillChannels (random, img.level());

        break;

      case MIPMAP_LEVELS:

        for (int x = 0; x < img.numLevels(); ++x)
        {
            cout << "        level " << x << "" << endl;
            fillChannels (random, img.level (x));
        }

        break;

      case RIPMAP_LEVELS:

        for (int y = 0; y < img.numYLevels(); ++y)
        {
            for (int x = 0; x < img.numXLevels(); ++x)
            {
                cout << "        level (" << x << ", " << y << ")" << endl;
                fillChannels (random, img.level (x, y));
            }
        }

        break;

      default:

        assert (false);
    }
}